

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,BinaryExpr *node)

{
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  BinaryExpr *local_18;
  BinaryExpr *node_local;
  RenameASTIdentifiers *this_local;
  
  local_18 = node;
  node_local = (BinaryExpr *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
            (&local_28,&node->lhs);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  if (local_18->op != Member) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (local_48,&local_18->rhs);
    visit(this,local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  }
  return;
}

Assistant:

void operator()(ast::BinaryExpr &node) const override {
    visit(node.lhs);
    if (node.op != ast::BinaryExpr::Member)
      visit(node.rhs);
  }